

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

CfgEdge * __thiscall CFG::findEdge(CFG *this,CfgNode *src,CfgNode *dst)

{
  CfgEdge *this_00;
  bool bVar1;
  set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_> *this_01;
  reference ppCVar2;
  CfgNode *pCVar3;
  CfgEdge *edge;
  iterator __end2;
  iterator __begin2;
  set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_> *__range2;
  CfgNode *dst_local;
  CfgNode *src_local;
  CFG *this_local;
  
  bVar1 = containsNode(this,src);
  if ((bVar1) && (bVar1 = containsNode(this,dst), bVar1)) {
    this_01 = edges(this);
    __end2 = std::set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_>::begin(this_01);
    edge = (CfgEdge *)
           std::set<CfgEdge_*,_std::less<CfgEdge_*>,_std::allocator<CfgEdge_*>_>::end(this_01);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&edge), bVar1) {
      ppCVar2 = std::_Rb_tree_const_iterator<CfgEdge_*>::operator*(&__end2);
      this_00 = *ppCVar2;
      pCVar3 = CfgEdge::source(this_00);
      if ((pCVar3 == src) && (pCVar3 = CfgEdge::destination(this_00), pCVar3 == dst)) {
        return this_00;
      }
      std::_Rb_tree_const_iterator<CfgEdge_*>::operator++(&__end2);
    }
  }
  return (CfgEdge *)0x0;
}

Assistant:

CfgEdge* CFG::findEdge(CfgNode* src, CfgNode* dst) const {
	if (this->containsNode(src) && this->containsNode(dst)) {
		for (CfgEdge* edge : this->edges()) {
			if (edge->source() == src && edge->destination() == dst)
				return edge;
		}
	}

	return 0;
}